

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O3

bool Js::JavascriptLibrary::InitializePromiseConstructor
               (DynamicObject *promiseConstructor,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  JavascriptLibrary *this;
  ScriptContext *this_00;
  RuntimeFunction *pRVar1;
  PropertyString *pPVar2;
  JavascriptFunction *pJVar3;
  
  DeferredTypeHandlerBase::Convert(typeHandler,promiseConstructor,mode,9,0);
  this = (((promiseConstructor->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
  this_00 = (this->super_JavascriptLibraryBase).scriptContext.ptr;
  (*(promiseConstructor->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (promiseConstructor,0xd1,&DAT_1000000000001,2,0,0,0);
  (*(promiseConstructor->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (promiseConstructor,0x124,(this->super_JavascriptLibraryBase).promisePrototype.ptr,0,0,0
             ,0);
  pRVar1 = CreateGetterFunction
                     (this,0x2c6,(FunctionInfo *)JavascriptPromise::EntryInfo::GetterSymbolSpecies);
  if (pRVar1 == (RuntimeFunction *)0x0) {
    pRVar1 = (RuntimeFunction *)(this->super_JavascriptLibraryBase).undefinedValue.ptr;
  }
  (*(promiseConstructor->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x2d])(promiseConstructor,0x19,pRVar1)
  ;
  (*(promiseConstructor->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x3e])(promiseConstructor,0x19,6);
  pPVar2 = ScriptContext::GetPropertyString(this_00,0x43);
  (*(promiseConstructor->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (promiseConstructor,0x106,pPVar2,2,0,0,0);
  pRVar1 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptPromise::EntryInfo::All,1,(DynamicObject *)0x0,
                      (DynamicType *)0x0,0x4b);
  (*(promiseConstructor->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (promiseConstructor,0x4b,pRVar1,6,0,0,0);
  pRVar1 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptPromise::EntryInfo::AllSettled,1,
                      (DynamicObject *)0x0,(DynamicType *)0x0,0x4c);
  (*(promiseConstructor->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (promiseConstructor,0x4c,pRVar1,6,0,0,0);
  if (((this_00->config).threadConfig)->m_ESPromiseAny == true) {
    pRVar1 = DefaultCreateFunction
                       (this,(FunctionInfo *)JavascriptPromise::EntryInfo::Any,1,
                        (DynamicObject *)0x0,(DynamicType *)0x0,0x1f);
    (*(promiseConstructor->super_RecyclableObject).super_FinalizableObject.
      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
              (promiseConstructor,0x1f,pRVar1,6,0,0,0);
  }
  pRVar1 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptPromise::EntryInfo::Race,1,(DynamicObject *)0x0
                      ,(DynamicType *)0x0,0x128);
  (*(promiseConstructor->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (promiseConstructor,0x128,pRVar1,6,0,0,0);
  pRVar1 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptPromise::EntryInfo::Reject,1,
                      (DynamicObject *)0x0,(DynamicType *)0x0,0x131);
  (*(promiseConstructor->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (promiseConstructor,0x131,pRVar1,6,0,0,0);
  pJVar3 = EnsurePromiseResolveFunction(this);
  (*(promiseConstructor->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (promiseConstructor,0x134,pJVar3,6,0,0,0);
  DynamicObject::SetHasNoEnumerableProperties(promiseConstructor,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializePromiseConstructor(DynamicObject* promiseConstructor, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(promiseConstructor, mode, 9);
        // Note: Any new function addition/deletion/modification should also be updated in JavascriptLibrary::ProfilerRegisterPromise
        // so that the update is in sync with profiler
        JavascriptLibrary* library = promiseConstructor->GetLibrary();
        ScriptContext* scriptContext = promiseConstructor->GetScriptContext();
        library->AddMember(promiseConstructor, PropertyIds::length, TaggedInt::ToVarUnchecked(1), PropertyConfigurable);
        library->AddMember(promiseConstructor, PropertyIds::prototype, library->promisePrototype, PropertyNone);
        library->AddSpeciesAccessorsToLibraryObject(promiseConstructor, &JavascriptPromise::EntryInfo::GetterSymbolSpecies);
        library->AddMember(promiseConstructor, PropertyIds::name, scriptContext->GetPropertyString(PropertyIds::Promise), PropertyConfigurable);

        library->AddFunctionToLibraryObject(promiseConstructor, PropertyIds::all, &JavascriptPromise::EntryInfo::All, 1);
        library->AddFunctionToLibraryObject(promiseConstructor, PropertyIds::allSettled, &JavascriptPromise::EntryInfo::AllSettled, 1);
        if (scriptContext->GetConfig()->IsESPromiseAnyEnabled())
        {
            library->AddFunctionToLibraryObject(promiseConstructor, PropertyIds::any, &JavascriptPromise::EntryInfo::Any, 1);
        }
        library->AddFunctionToLibraryObject(promiseConstructor, PropertyIds::race, &JavascriptPromise::EntryInfo::Race, 1);
        library->AddFunctionToLibraryObject(promiseConstructor, PropertyIds::reject, &JavascriptPromise::EntryInfo::Reject, 1);
        library->AddMember(promiseConstructor, PropertyIds::resolve, library->EnsurePromiseResolveFunction(), PropertyBuiltInMethodDefaults);

        promiseConstructor->SetHasNoEnumerableProperties(true);

        return true;
    }